

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O1

void get_remote_block_pos
               (Integer idx,Integer ndim,Integer *lo_loc,Integer *hi_loc,Integer *slo_rem,
               Integer *shi_rem,Integer *dims,Integer *width)

{
  long lVar1;
  long lVar2;
  Integer IVar3;
  Integer IStack_88;
  Integer lo_rem [7];
  long lStack_48;
  Integer hi_rem [7];
  
  if (0 < ndim) {
    lVar1 = 0;
    do {
      if (idx == lVar1) {
        lVar2 = hi_loc[lVar1];
        lo_rem[lVar1 + -1] = lVar2 + 1;
        IVar3 = lVar2 + width[lVar1];
      }
      else {
        lo_rem[lVar1 + -1] = lo_loc[lVar1];
        IVar3 = hi_loc[lVar1];
      }
      hi_rem[lVar1 + -1] = IVar3;
      lVar1 = lVar1 + 1;
    } while (ndim != lVar1);
  }
  if (0 < ndim) {
    lVar1 = 0;
    do {
      if (idx == lVar1) {
        lVar2 = hi_rem[lVar1 + -1];
        if (dims[lVar1] < lVar2) {
          slo_rem[lVar1] = 1;
          lVar2 = width[lVar1];
        }
        else {
          slo_rem[lVar1] = lo_rem[lVar1 + -1];
        }
      }
      else {
        slo_rem[lVar1] = lo_rem[lVar1 + -1];
        lVar2 = hi_rem[lVar1 + -1];
      }
      shi_rem[lVar1] = lVar2;
      lVar1 = lVar1 + 1;
    } while (ndim != lVar1);
  }
  return;
}

Assistant:

static void get_remote_block_pos(Integer idx, Integer ndim, Integer *lo_loc,
                          Integer *hi_loc, Integer *slo_rem, Integer *shi_rem,
                          Integer *dims, Integer *width)
{
  Integer i, lo_rem[MAXDIM], hi_rem[MAXDIM];
  /* Start by getting rough idea of where data needs to go. */
  for (i = 0; i < ndim; i++) {
    if (i == idx) {
      lo_rem[i] = hi_loc[i] + 1;
      hi_rem[i] = hi_loc[i] + width[i];
    } else {
      lo_rem[i] = lo_loc[i];
      hi_rem[i] = hi_loc[i];
    }
  }

  /* Account for boundaries, if necessary. */
  for (i=0; i<ndim; i++) {
    if (i == idx) {
      if (hi_rem[i] > dims[i]) {
        slo_rem[i] = 1;
        shi_rem[i] = width[i];
      } else {
        slo_rem[i] = lo_rem[i];
        shi_rem[i] = hi_rem[i];
      }
    } else {
      slo_rem[i] = lo_rem[i];
      shi_rem[i] = hi_rem[i];
    }
  }
}